

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void av1_crc_calculator_init(CRC_CALCULATOR *p_crc_calculator,uint32_t bits,uint32_t truncPoly)

{
  uint uVar1;
  uint32_t value;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  p_crc_calculator->remainder = 0;
  p_crc_calculator->bits = bits;
  p_crc_calculator->trunc_poly = truncPoly;
  p_crc_calculator->final_result_mask = ~(-1 << ((byte)bits & 0x1f));
  uVar1 = 1 << ((byte)bits - 1 & 0x1f);
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    uVar5 = 0;
    for (uVar3 = 0x80; uVar3 != 0; uVar3 = uVar3 >> 1) {
      uVar4 = uVar3 & (uint)lVar2;
      if (uVar4 != 0) {
        uVar4 = uVar1;
      }
      uVar6 = (uVar4 ^ uVar5) & uVar1;
      if (uVar6 != 0) {
        uVar6 = truncPoly;
      }
      uVar5 = (uVar4 ^ uVar5) * 2 ^ uVar6;
    }
    p_crc_calculator->table[lVar2] = uVar5;
  }
  return;
}

Assistant:

void av1_crc_calculator_init(CRC_CALCULATOR *p_crc_calculator, uint32_t bits,
                             uint32_t truncPoly) {
  p_crc_calculator->remainder = 0;
  p_crc_calculator->bits = bits;
  p_crc_calculator->trunc_poly = truncPoly;
  p_crc_calculator->final_result_mask = (1 << bits) - 1;
  crc_calculator_init_table(p_crc_calculator);
}